

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::ParseScriptRequest,cfd::js::api::json::ParseScriptResponse,cfd::js::api::ParseScriptRequestStruct,cfd::js::api::ParseScriptResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::ParseScriptResponseStruct_(const_cfd::js::api::ParseScriptRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_4c8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_410 [4];
  JsonClassBase<cfd::js::api::json::ParseScriptResponse> local_3f0 [4];
  undefined1 local_3d0 [8];
  ParseScriptResponse res_2;
  undefined1 local_370 [8];
  ParseScriptResponseStruct response;
  ParseScriptRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_78 [8];
  ParseScriptRequest req;
  function<cfd::js::api::ParseScriptResponseStruct_(const_cfd::js::api::ParseScriptRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._80_8_ = call_function;
  ParseScriptRequest::ParseScriptRequest((ParseScriptRequest *)local_78);
  core::JsonClassBase<cfd::js::api::json::ParseScriptRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::ParseScriptRequest> *)local_78,request_message);
  ParseScriptRequest::ConvertToStruct
            ((ParseScriptRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ParseScriptRequest *)local_78);
  std::
  function<cfd::js::api::ParseScriptResponseStruct_(const_cfd::js::api::ParseScriptRequestStruct_&)>
  ::operator()((ParseScriptResponseStruct *)local_370,call_function,
               (ParseScriptRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2.script_items_.
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if ((int)response.script_items.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    ParseScriptResponse::ParseScriptResponse((ParseScriptResponse *)local_3d0);
    ParseScriptResponse::ConvertFromStruct
              ((ParseScriptResponse *)local_3d0,(ParseScriptResponseStruct *)local_370);
    core::JsonClassBase<cfd::js::api::json::ParseScriptResponse>::Serialize_abi_cxx11_(local_3f0);
    std::__cxx11::string::operator=((string *)this,(string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3f0);
    ParseScriptResponse::~ParseScriptResponse((ParseScriptResponse *)local_3d0);
  }
  else {
    ErrorResponse::ConvertFromStruct
              (&local_4c8,
               (InnerErrorResponseStruct *)
               &response.script_items.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_410);
    std::__cxx11::string::operator=((string *)this,(string *)local_410);
    std::__cxx11::string::~string((string *)local_410);
    ErrorResponse::~ErrorResponse(&local_4c8);
  }
  res_2.script_items_.
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  ParseScriptResponseStruct::~ParseScriptResponseStruct((ParseScriptResponseStruct *)local_370);
  ParseScriptRequestStruct::~ParseScriptRequestStruct
            ((ParseScriptRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ParseScriptRequest::~ParseScriptRequest((ParseScriptRequest *)local_78);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}